

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Print_patch(int g_a,int *lo,int *hi,int pretty)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer p;
  Integer ndim;
  Integer a;
  Integer in_stack_00000130;
  Integer in_stack_ffffffffffffff38;
  int iVar1;
  int iVar2;
  Integer *in_stack_ffffffffffffff48;
  Integer in_stack_ffffffffffffff50;
  long local_78 [8];
  long local_38;
  long local_30;
  long local_28;
  int local_1c;
  long local_18;
  long local_10;
  
  local_28 = (long)in_EDI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = pnga_ndim(in_stack_00000130);
  local_38 = (long)local_1c;
  for (iVar2 = 0; iVar2 < local_30; iVar2 = iVar2 + 1) {
    local_78[(local_30 - iVar2) + -1] = (long)*(int *)(local_10 + (long)iVar2 * 4) + 1;
  }
  for (iVar1 = 0; iVar1 < local_30; iVar1 = iVar1 + 1) {
    *(long *)(&stack0xffffffffffffff48 + ((local_30 - iVar1) + -1) * 8) =
         (long)*(int *)(local_18 + (long)iVar1 * 4) + 1;
  }
  pnga_print_patch(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (Integer *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffff38);
  return;
}

Assistant:

void NGA_Print_patch(int g_a, int lo[], int hi[], int pretty)
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer p = (Integer)pretty;
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];

    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    wnga_print_patch(a, _ga_lo, _ga_hi, p);
}